

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
          (List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *this,
          List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list)

{
  uint *dst;
  int iVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint **ppuVar4;
  uint *src;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list_local;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_local;
  
  iVar1 = ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count
                    (&list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
  if (0 < iVar1) {
    iVar1 = ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count
                      (&list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
    List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::EnsureArray
              ((List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
               this,iVar1);
    ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)(this + 8));
    dst = *ppuVar4;
    uVar2 = UInt32Math::Mul(4,*(uint32 *)(this + 0x20));
    src = ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::GetBuffer
                    (&list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
    uVar3 = ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count
                      (&list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
    uVar3 = UInt32Math::Mul(4,uVar3);
    js_memcpy_s(dst,(ulong)uVar2,src,(ulong)uVar3);
  }
  iVar1 = ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count
                    (&list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
  *(int *)(this + 0x10) = iVar1;
  return;
}

Assistant:

void Copy(const U* list)
        {
            CompileAssert(sizeof(TElementType) == sizeof(typename U::TElementType));
            if (list->Count() > 0)
            {
                this->EnsureArray(list->Count());
                js_memcpy_s(this->buffer, UInt32Math::Mul(sizeof(TElementType), this->length), list->GetBuffer(), UInt32Math::Mul(sizeof(TElementType), list->Count()));
            }
            this->count = list->Count();
        }